

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall gnuplotio::Gnuplot::Gnuplot(Gnuplot *this,string *_cmd)

{
  GnuplotTmpfileCollection *this_00;
  FileHandleWrapper FVar1;
  file_descriptor_flags local_50;
  int local_4c;
  FILE *local_48;
  undefined1 local_40;
  FILE *local_28;
  undefined1 uStack_20;
  undefined7 uStack_1f;
  string *local_18;
  string *_cmd_local;
  Gnuplot *this_local;
  
  local_18 = _cmd;
  _cmd_local = (string *)this;
  std::ios::ios((ios *)&this->field_0xc0);
  FVar1 = open_cmdline(local_18);
  local_48 = FVar1.wrapped_fh;
  local_40 = FVar1.should_use_pclose;
  (this->super_FileHandleWrapper).wrapped_fh = local_48;
  *(ulong *)&(this->super_FileHandleWrapper).should_use_pclose = CONCAT71(uStack_1f,local_40);
  *(undefined8 *)this = 0x1191c0;
  *(undefined8 *)&this->field_0xc0 = 0x1191e8;
  local_28 = local_48;
  uStack_20 = local_40;
  local_4c = FileHandleWrapper::fh_fileno(&this->super_FileHandleWrapper);
  local_50 = never_close_handle;
  boost::iostreams::
  stream<boost::iostreams::file_descriptor_sink,std::char_traits<char>,std::allocator<char>>::
  stream<int,boost::iostreams::file_descriptor_flags>
            ((stream<boost::iostreams::file_descriptor_sink,std::char_traits<char>,std::allocator<char>>
              *)this,&PTR_construction_vtable_24__00119200,&local_4c,&local_50,(type *)0x0);
  *(undefined8 *)this = 0x1191c0;
  *(undefined8 *)&this->field_0xc0 = 0x1191e8;
  this->feedback = (GnuplotFeedback *)0x0;
  this_00 = (GnuplotTmpfileCollection *)operator_new(0x18);
  (this_00->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GnuplotTmpfileCollection::GnuplotTmpfileCollection(this_00);
  std::shared_ptr<gnuplotio::GnuplotTmpfileCollection>::
  shared_ptr<gnuplotio::GnuplotTmpfileCollection,void>(&this->tmp_files,this_00);
  this->debug_messages = false;
  this->transport_tmpfile = false;
  set_stream_options(this,(ostream *)this);
  return;
}

Assistant:

explicit Gnuplot(const std::string &_cmd="") :
        FileHandleWrapper(open_cmdline(_cmd)),
        boost::iostreams::stream<boost::iostreams::file_descriptor_sink>(
            fh_fileno(),
#if BOOST_VERSION >= 104400
            boost::iostreams::never_close_handle
#else
            false
#endif
        ),
        feedback(nullptr),
        tmp_files(new GnuplotTmpfileCollection()),
        debug_messages(false),
        transport_tmpfile(false)
    {
        set_stream_options(*this);
    }